

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  WorkingMode WVar3;
  uint uVar4;
  cmState *this_00;
  undefined4 extraout_var;
  cmCommand *pcVar5;
  char *pcVar6;
  cmake *pcVar7;
  allocator local_111;
  undefined1 local_110 [8];
  string error_1;
  allocator local_c9;
  undefined1 local_c8 [8];
  string error;
  allocator local_99;
  string local_98;
  auto_ptr<cmCommand> local_78;
  auto_ptr<cmCommand> pcmd;
  cmCommand *proto;
  cmMakefileCall local_58;
  cmMakefileCall stack_manager;
  string name;
  bool result;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  name.field_2._M_local_buf[0xf] = '\x01';
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    return true;
  }
  std::__cxx11::string::string((string *)&stack_manager,(string *)lff);
  cmMakefileCall::cmMakefileCall(&local_58,this,&lff->super_cmCommandContext,status);
  this_00 = GetState(this);
  pcmd.x_ = cmState::GetCommand(this_00,(string *)&stack_manager);
  if (pcmd.x_ == (cmCommand *)0x0) {
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_110,"Unknown CMake command \"",&local_111);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::operator+=((string *)local_110,(string *)lff);
      std::__cxx11::string::operator+=((string *)local_110,"\".");
      IssueMessage(this,FATAL_ERROR,(string *)local_110,false);
      cmSystemTools::SetFatalErrorOccured();
      std::__cxx11::string::~string((string *)local_110);
    }
    name.field_2._M_local_buf[0xf] = bVar1;
    goto LAB_006d2f35;
  }
  iVar2 = (*((pcmd.x_)->super_cmObject)._vptr_cmObject[8])();
  cmsys::auto_ptr<cmCommand>::auto_ptr(&local_78,(cmCommand *)CONCAT44(extraout_var,iVar2));
  pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
  cmCommand::SetMakefile(pcVar5,this);
  pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
  bVar1 = cmCommand::GetEnabled(pcVar5);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetFatalErrorOccured(), bVar1)) {
LAB_006d2cb6:
    pcVar7 = GetCMakeInstance(this);
    WVar3 = cmake::GetWorkingMode(pcVar7);
    if (WVar3 == SCRIPT_MODE) {
      pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
      uVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[9])();
      if ((uVar4 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_c8,"Command ",&local_c9);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
        (*(pcVar5->super_cmObject)._vptr_cmObject[0xb])((undefined1 *)((long)&error_1.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)local_c8,(string *)(error_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(error_1.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_c8,"() is not scriptable");
        IssueMessage(this,FATAL_ERROR,(string *)local_c8,false);
        name.field_2._M_local_buf[0xf] = '\0';
        cmSystemTools::SetFatalErrorOccured();
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
  }
  else {
    pcVar7 = GetCMakeInstance(this);
    WVar3 = cmake::GetWorkingMode(pcVar7);
    if (WVar3 == SCRIPT_MODE) {
      pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
      uVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[9])();
      if ((uVar4 & 1) == 0) goto LAB_006d2cb6;
    }
    pcVar7 = GetCMakeInstance(this);
    bVar1 = cmake::GetTrace(pcVar7);
    if (bVar1) {
      PrintCommandTrace(this,lff);
    }
    pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
    uVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[4])(pcVar5,&lff->Arguments,status);
    if (((uVar4 & 1) == 0) || (bVar1 = cmExecutionStatus::GetNestedError(status), bVar1)) {
      bVar1 = cmExecutionStatus::GetNestedError(status);
      if (!bVar1) {
        pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
        pcVar6 = cmCommand::GetError(pcVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_98,pcVar6,&local_99);
        IssueMessage(this,FATAL_ERROR,&local_98,false);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      name.field_2._M_local_buf[0xf] = '\0';
      pcVar7 = GetCMakeInstance(this);
      WVar3 = cmake::GetWorkingMode(pcVar7);
      if (WVar3 != NORMAL_MODE) {
        cmSystemTools::SetFatalErrorOccured();
      }
    }
    else {
      pcVar5 = cmsys::auto_ptr<cmCommand>::operator->(&local_78);
      uVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[7])();
      if ((uVar4 & 1) != 0) {
        error.field_2._8_8_ = cmsys::auto_ptr<cmCommand>::release(&local_78);
        std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back
                  (&this->FinalPassCommands,(value_type *)((long)&error.field_2 + 8));
      }
    }
  }
  cmsys::auto_ptr<cmCommand>::~auto_ptr(&local_78);
LAB_006d2f35:
  cmMakefileCall::~cmMakefileCall(&local_58);
  std::__cxx11::string::~string((string *)&stack_manager);
  return (bool)name.field_2._M_local_buf[0xf];
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus &status)
{
  bool result = true;

  // quick return if blocked
  if(this->IsFunctionBlocked(lff,status))
    {
    // No error.
    return result;
    }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if(cmCommand* proto = this->GetState()->GetCommand(name))
    {
    // Clone the prototype.
    cmsys::auto_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if(pcmd->GetEnabled() && !cmSystemTools::GetFatalErrorOccured()  &&
       (this->GetCMakeInstance()->GetWorkingMode() != cmake::SCRIPT_MODE
       || pcmd->IsScriptable()))

      {
      // if trace is enabled, print out invoke information
      if(this->GetCMakeInstance()->GetTrace())
        {
        this->PrintCommandTrace(lff);
        }
      // Try invoking the command.
      if(!pcmd->InvokeInitialPass(lff.Arguments,status) ||
         status.GetNestedError())
        {
        if(!status.GetNestedError())
          {
          // The command invocation requested that we report an error.
          this->IssueMessage(cmake::FATAL_ERROR, pcmd->GetError());
          }
        result = false;
        if ( this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE)
          {
          cmSystemTools::SetFatalErrorOccured();
          }
        }
      else if(pcmd->HasFinalPass())
        {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
        }
      }
    else if ( this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE
              && !pcmd->IsScriptable() )
      {
      std::string error = "Command ";
      error += pcmd->GetName();
      error += "() is not scriptable";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }
  else
    {
    if(!cmSystemTools::GetFatalErrorOccured())
      {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }

  return result;
}